

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.h
# Opt level: O1

void __thiscall
Dual_Resampler::mix_samples(Dual_Resampler *this,Blip_Buffer *blip_buf,dsample_t *out)

{
  uint uVar1;
  int iVar2;
  short *psVar3;
  buf_t_ *pbVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  iVar7 = blip_buf->reader_accum_;
  uVar1 = this->sample_buf_size;
  if (1 < uVar1) {
    iVar2 = blip_buf->bass_shift_;
    psVar3 = (this->sample_buf).begin_;
    pbVar4 = blip_buf->buffer_;
    lVar8 = 0;
    do {
      iVar9 = iVar7 >> 0xe;
      iVar7 = (iVar7 - (iVar7 >> ((byte)iVar2 & 0x1f))) + pbVar4[lVar8];
      auVar10 = ZEXT416(*(uint *)(psVar3 + lVar8 * 2));
      auVar10 = pshuflw(auVar10,auVar10,0x60);
      uVar5 = (auVar10._8_4_ >> 0x10) * 2;
      uVar6 = (auVar10._12_4_ >> 0x10) * 2;
      auVar11._0_4_ = iVar9 + (auVar10._0_4_ >> 0x10) * 2;
      auVar11._4_4_ = iVar9 + (auVar10._4_4_ >> 0x10) * 2;
      auVar11._8_4_ = uVar5;
      auVar11._12_4_ = uVar6;
      auVar10._0_4_ = -(uint)(-0x7fff0001 < (int)(auVar11._0_4_ + 0x8000U ^ 0x80000000));
      auVar10._4_4_ = -(uint)(-0x7fff0001 < (int)(auVar11._4_4_ + 0x8000U ^ 0x80000000));
      auVar10._8_4_ = -(uint)(0 < (int)(uVar5 ^ 0x80000000));
      auVar10._12_4_ = -(uint)(0 < (int)(uVar6 ^ 0x80000000));
      auVar12._0_4_ = 0x7fff - (auVar11._0_4_ >> 0x18);
      auVar12._4_4_ = 0x7fff - (auVar11._4_4_ >> 0x18);
      auVar12._8_4_ = -((int)uVar5 >> 0x18);
      auVar12._12_4_ = -((int)uVar6 >> 0x18);
      auVar10 = ~auVar10 & auVar11 | auVar12 & auVar10;
      auVar10 = pshuflw(auVar10,auVar10,0xe8);
      *(int *)(out + lVar8 * 2) = auVar10._0_4_;
      lVar8 = lVar8 + 1;
    } while ((int)uVar1 >> 1 != (int)lVar8);
  }
  blip_buf->reader_accum_ = iVar7;
  return;
}

Assistant:

inline int Blip_Reader::begin( Blip_Buffer& blip_buf )
{
	buf = blip_buf.buffer_;
	accum = blip_buf.reader_accum_;
	return blip_buf.bass_shift_;
}